

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigPhase.c
# Opt level: O0

void Saig_TsiPrintTraces(Saig_Tsim_t *p,int nWords,int nPrefix,int nLoop)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint *p_00;
  int local_38;
  int Counter;
  int k;
  int i;
  int Value;
  int nRegs;
  uint *pState;
  int nLoop_local;
  int nPrefix_local;
  int nWords_local;
  Saig_Tsim_t *p_local;
  
  iVar1 = p->pAig->nRegs;
  printf("Ternary traces for each flop:\n");
  printf("      : ");
  for (Counter = 0; iVar2 = Vec_PtrSize(p->vStates), Counter < (iVar2 - nLoop) + -1;
      Counter = Counter + 1) {
    printf("%d",(long)Counter % 10 & 0xffffffff);
  }
  printf("  ");
  for (Counter = 0; Counter < nLoop; Counter = Counter + 1) {
    printf("%d",(long)Counter % 10 & 0xffffffff);
  }
  printf("\n");
  Counter = 0;
  do {
    if (iVar1 <= Counter) {
      return;
    }
    printf("%5d : ");
    for (local_38 = 0; iVar2 = Vec_PtrSize(p->vStates), local_38 < iVar2 + -1;
        local_38 = local_38 + 1) {
      p_00 = (uint *)Vec_PtrEntry(p->vStates,local_38);
      iVar2 = Abc_InfoHasBit(p_00,Counter * 2 + 1);
      uVar3 = Abc_InfoHasBit(p_00,Counter << 1);
      uVar3 = iVar2 << 1 | uVar3;
      if (uVar3 == 1) {
        printf("0");
      }
      else if (uVar3 == 2) {
        printf("1");
      }
      else {
        if (uVar3 != 3) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigPhase.c"
                        ,0x15a,"void Saig_TsiPrintTraces(Saig_Tsim_t *, int, int, int)");
        }
        printf("x");
      }
      if (local_38 == nPrefix + -1) {
        printf("  ");
      }
    }
    printf("\n");
    Counter = Counter + 1;
  } while( true );
}

Assistant:

void Saig_TsiPrintTraces( Saig_Tsim_t * p, int nWords, int nPrefix, int nLoop )
{
    unsigned * pState;
    int nRegs = p->pAig->nRegs;
    int Value, i, k, Counter = 0;
    printf( "Ternary traces for each flop:\n" );
    printf( "      : " );
    for ( i = 0; i < Vec_PtrSize(p->vStates) - nLoop - 1; i++ )
        printf( "%d", i%10 );
    printf( "  " );
    for ( i = 0; i < nLoop; i++ )
        printf( "%d", i%10 );
    printf( "\n" );
    for ( i = 0; i < nRegs; i++ )
    {
/*
        Vec_PtrForEachEntry( unsigned *, p->vStates, pState, k )
        {
            Value = (Abc_InfoHasBit( pState, 2 * i + 1 ) << 1) | Abc_InfoHasBit( pState, 2 * i );
            if ( Value == SAIG_XVSX )
                break;
        }
        if ( k == Vec_PtrSize(p->vStates) )
            Counter++;
        else
            continue;
*/

        // print trace
//        printf( "%5d : %5d %5d  ", Counter, i, Saig_ManLo(p->pAig, i)->Id );
        printf( "%5d : ", Counter++ );
        Vec_PtrForEachEntryStop( unsigned *, p->vStates, pState, k, Vec_PtrSize(p->vStates)-1 )
        {
            Value = (Abc_InfoHasBit( pState, 2 * i + 1 ) << 1) | Abc_InfoHasBit( pState, 2 * i );
            if ( Value == SAIG_XVS0 )
                printf( "0" );
            else if ( Value == SAIG_XVS1 )
                printf( "1" );
            else if ( Value == SAIG_XVSX )
                printf( "x" );
            else
                assert( 0 );
            if ( k == nPrefix - 1 )
                printf( "  " );
        }
        printf( "\n" );
    }
}